

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

double __thiscall ON_EarthAnchorPoint::KMLOrientationRollAngleRadians(ON_EarthAnchorPoint *this)

{
  bool bVar1;
  double local_38;
  double dStack_28;
  bool rc;
  double roll_radians;
  double tilt_radians;
  double heading_radians;
  ON_EarthAnchorPoint *this_local;
  
  tilt_radians = ON_DBL_QNAN;
  roll_radians = ON_DBL_QNAN;
  dStack_28 = ON_DBL_QNAN;
  heading_radians = (double)this;
  bVar1 = GetKMLOrientationAnglesRadians(this,&tilt_radians,&roll_radians,&stack0xffffffffffffffd8);
  if (bVar1) {
    local_38 = dStack_28;
  }
  else {
    local_38 = ON_DBL_QNAN;
  }
  return local_38;
}

Assistant:

const double ON_EarthAnchorPoint::KMLOrientationRollAngleRadians() const
{
  double heading_radians = ON_DBL_QNAN;
  double tilt_radians = ON_DBL_QNAN;
  double roll_radians = ON_DBL_QNAN;
  const bool rc = GetKMLOrientationAnglesRadians(heading_radians, tilt_radians, roll_radians);
  return rc ? roll_radians : ON_DBL_QNAN;
}